

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.hpp
# Opt level: O0

void __thiscall LongReadsDatastore::~LongReadsDatastore(LongReadsDatastore *this)

{
  LongReadsMapper *in_RDI;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> *unaff_retaddr;
  
  if (in_RDI->max_index_freq != 0) {
    close(in_RDI->max_index_freq);
  }
  LongReadsMapper::~LongReadsMapper(in_RDI);
  std::__cxx11::string::~string((string *)&(in_RDI->all_paths_between)._M_h._M_bucket_count);
  std::__cxx11::string::~string((string *)&in_RDI->first_mapping);
  std::__cxx11::string::~string((string *)&in_RDI->datastore);
  std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

~LongReadsDatastore(){
        if (fd) {
            close(fd);
        }
    }